

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgnometheme.cpp
# Opt level: O2

QFont * __thiscall QGnomeTheme::font(QGnomeTheme *this,Font type)

{
  QGnomeThemePrivate *this_00;
  QFont *pQVar1;
  QFont **ppQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QGnomeThemePrivate *)(this->super_QGenericUnixTheme).super_QPlatformTheme.d_ptr.d;
  if (this_00->systemFont == (QFont *)0x0) {
    (*(this->super_QGenericUnixTheme).super_QPlatformTheme._vptr_QPlatformTheme[0x15])
              (&QStack_38,this);
    QGnomeThemePrivate::configureFonts(this_00,(QString *)&QStack_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  }
  if (type == SystemFont) {
    ppQVar2 = &this_00->systemFont;
  }
  else {
    if (type != FixedFont) {
      pQVar1 = (QFont *)0x0;
      goto LAB_00588342;
    }
    ppQVar2 = &this_00->fixedFont;
  }
  pQVar1 = *ppQVar2;
LAB_00588342:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

const QFont *QGnomeTheme::font(Font type) const
{
    Q_D(const QGnomeTheme);
    if (!d->systemFont)
        d->configureFonts(gtkFontName());
    switch (type) {
    case QPlatformTheme::SystemFont:
        return d->systemFont;
    case QPlatformTheme::FixedFont:
        return d->fixedFont;
    default:
        return nullptr;
    }
}